

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdial.cpp
# Opt level: O1

void QDial::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  
  if (_c == WriteProperty) {
    pbVar1 = (byte *)*_a;
    if (_id == 3) {
      *(byte *)(*(long *)(_o + 8) + 0x298) = *(byte *)(*(long *)(_o + 8) + 0x298) & 0xfe | *pbVar1;
    }
    else if (_id == 2) {
      *(undefined8 *)(*(long *)(_o + 8) + 0x290) = *(undefined8 *)pbVar1;
    }
    else {
      if (_id != 0) {
        return;
      }
      bVar2 = *(byte *)(*(long *)(_o + 8) + 0x298);
      if (((bVar2 & 2) == 0) != (bool)*pbVar1) {
        return;
      }
      *(byte *)(*(long *)(_o + 8) + 0x298) = bVar2 & 0xfd | *pbVar1 * '\x02';
    }
    QWidget::update((QWidget *)_o);
    return;
  }
  if (_c != ReadProperty) {
    if (_c != InvokeMetaMethod) {
      return;
    }
    if (_id == 1) {
      bVar2 = *(byte *)(*(long *)(_o + 8) + 0x298);
      if (((bVar2 & 2) == 0) != (bool)*_a[1]) {
        return;
      }
      *(byte *)(*(long *)(_o + 8) + 0x298) = bVar2 & 0xfd | *_a[1] * '\x02';
    }
    else {
      if (_id != 0) {
        return;
      }
      *(byte *)(*(long *)(_o + 8) + 0x298) = *(byte *)(*(long *)(_o + 8) + 0x298) & 0xfe | *_a[1];
    }
    QWidget::update((QWidget *)_o);
    return;
  }
  if ((uint)_id < 4) {
    pbVar1 = (byte *)*_a;
    switch(_id) {
    case 0:
      bVar2 = *(byte *)(*(long *)(_o + 8) + 0x298) >> 1;
      break;
    case 1:
      iVar3 = notchSize((QDial *)_o);
      *(int *)pbVar1 = iVar3;
      return;
    case 2:
      *(undefined8 *)pbVar1 = *(undefined8 *)(*(long *)(_o + 8) + 0x290);
      return;
    case 3:
      bVar2 = *(byte *)(*(long *)(_o + 8) + 0x298);
    }
    *pbVar1 = bVar2 & 1;
    return;
  }
  return;
}

Assistant:

void QDial::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDial *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->setNotchesVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->setWrapping((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->wrapping(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->notchSize(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->notchTarget(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->notchesVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWrapping(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setNotchTarget(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->setNotchesVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}